

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

char * str_cpynextword(char *dst,char *src,size_t len)

{
  ulong uVar1;
  long lVar2;
  ushort **ppuVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  
  if (src == (char *)0x0) {
    *dst = '\0';
    pcVar7 = (char *)0x0;
  }
  else {
    ppuVar3 = __ctype_b_loc();
    pcVar7 = src + -1;
    do {
      pcVar6 = pcVar7;
      uVar4 = (ulong)pcVar6[1];
      pcVar7 = pcVar6 + 1;
    } while (((*ppuVar3)[uVar4] & 1) != 0);
    if (pcVar6[1] == '\0') {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      do {
        if ((((*ppuVar3)[(char)uVar4] & 1) != 0) || (len - 1 <= uVar5)) {
          pcVar7 = pcVar7 + uVar5;
          goto LAB_00129e39;
        }
        uVar1 = uVar5 + 1;
        dst[uVar5] = (char)uVar4;
        lVar2 = uVar5 + 2;
        uVar4 = (ulong)(byte)pcVar6[lVar2];
        uVar5 = uVar1;
      } while (pcVar6[lVar2] != 0);
      pcVar7 = pcVar7 + uVar1;
    }
LAB_00129e39:
    dst[uVar5] = '\0';
    pcVar7 = pcVar7 + -1;
    do {
      pcVar6 = pcVar7 + 1;
      pcVar7 = pcVar7 + 1;
    } while (((*ppuVar3)[*pcVar6] & 1) != 0);
    if (*pcVar6 == '\0') {
      pcVar7 = (char *)0x0;
    }
  }
  return pcVar7;
}

Assistant:

const char *
str_cpynextword(char *dst, const char *src, size_t len) {
  size_t i;

  /* sanity check */
  if (src == NULL) {
    *dst = 0;
    return NULL;
  }

  /* skip whitespace prefix */
  while (isblank(*src)) {
    src++;
  }

  /* copy next word */
  i = 0;
  while (*src != 0 && !isblank(*src) && i < len - 1) {
    dst[i++] = *src++;
  }

  /* terminate */
  dst[i] = 0;

  /* skip ahead in src */
  while (isblank(*src)) {
    src++;
  }

  if (*src) {
    /* return next word */
    return src;
  }

  /* end of src */
  return NULL;
}